

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_edf1.c
# Opt level: O0

void gga_x_optpbe_vdw_init(xc_func_type *p)

{
  double *in_RDI;
  undefined4 in_stack_00000008;
  int in_stack_0000000c;
  xc_func_type *in_stack_00000010;
  
  xc_mix_init(in_stack_00000010,in_stack_0000000c,(int *)p,in_RDI);
  xc_func_set_ext_params(in_stack_00000010,(double *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  xc_func_set_ext_params(in_stack_00000010,(double *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  return;
}

Assistant:

static void
gga_x_optpbe_vdw_init(xc_func_type *p)
{
  static int    funcs_id  [2] = {XC_GGA_X_PBE, XC_GGA_X_RPBE};
  static double funcs_coef[2] = {1.0 - 0.054732, 0.054732};

  static double par_pbe[]  = {1.04804, 0.175519};

  xc_mix_init(p, 2, funcs_id, funcs_coef);

  xc_func_set_ext_params(p->func_aux[0], par_pbe);
  xc_func_set_ext_params(p->func_aux[1], par_pbe);
}